

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status_internal.cc
# Opt level: O2

Nonnull<std::string_*>
absl::lts_20240722::status_internal::MakeCheckFailString_abi_cxx11_
          (Nonnull<const_absl::Status_*> status,Nonnull<const_char_*> prefix)

{
  AlphaNum *pAVar1;
  string local_f8;
  AlphaNum local_d8;
  AlphaNum local_a8;
  string_view local_78;
  AlphaNum local_48;
  
  pAVar1 = (AlphaNum *)operator_new(0x20);
  local_a8.piece_ = NullSafeStringView(prefix);
  local_d8.piece_ = NullSafeStringView(" (");
  Status::ToString_abi_cxx11_(&local_f8,status,kWithEverything);
  local_48.piece_._M_len = local_f8._M_string_length;
  local_48.piece_._M_str = local_f8._M_dataplus._M_p;
  local_78 = NullSafeStringView(")");
  absl::lts_20240722::StrCat_abi_cxx11_(pAVar1,&local_a8,&local_d8,&local_48);
  std::__cxx11::string::~string((string *)&local_f8);
  return (Nonnull<std::string_*>)pAVar1;
}

Assistant:

absl::Nonnull<std::string*> MakeCheckFailString(
    absl::Nonnull<const absl::Status*> status,
    absl::Nonnull<const char*> prefix) {
  return new std::string(
      absl::StrCat(prefix, " (",
                   status->ToString(StatusToStringMode::kWithEverything), ")"));
}